

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  uint newSize;
  Type TVar2;
  uint uVar3;
  EntryType *dst;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint bucketCount;
  Type local_40;
  int *newBuckets;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (bucketCount = uVar1 & 0x7fffffff, (uVar1 - 1 & bucketCount) != 0)) {
    iVar5 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar5 ^ 0x1f) & 0x1f);
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<int,Memory::WriteBarrierPtr<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Js::PropertyGuard>,Memory::Recycler>
              (dst,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<int,Memory::WriteBarrierPtr<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Js::PropertyGuard>,Memory::Recycler>
              ((SimpleDictionaryEntry<int,_Memory::WriteBarrierPtr<Js::PropertyGuard>_> *)newBuckets
               ,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar5 = this->count;
    if (0 < iVar5) {
      lVar6 = 0;
      lVar7 = 0;
      piVar4 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar4 + lVar6 + 8)) {
          uVar3 = GetBucket(*(int *)((long)piVar4 + lVar6 + 0xc) * 2 + 1,bucketCount,
                            this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar6 + 8) = local_40.ptr[(int)uVar3];
          local_40.ptr[(int)uVar3] = (int)lVar7;
          iVar5 = this->count;
          piVar4 = newBuckets;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 < iVar5);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar2.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar2.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (SimpleDictionaryEntry<int,_Memory::WriteBarrierPtr<Js::PropertyGuard>_> *)piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }